

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_keyexpimp.c
# Opt level: O0

int wrap_ctrl(EVP_CIPHER_CTX *ctx,int type,int arg,void *ptr)

{
  int in_ESI;
  EVP_CIPHER_CTX *in_RDI;
  undefined4 local_4;
  
  if (in_ESI == 0) {
    EVP_CIPHER_CTX_set_flags(in_RDI,1);
    local_4 = 1;
  }
  else {
    local_4 = -2;
  }
  return local_4;
}

Assistant:

static int wrap_ctrl (EVP_CIPHER_CTX *ctx, int type, int arg, void *ptr)
{
	switch(type)
	{
		case EVP_CTRL_INIT:
			EVP_CIPHER_CTX_set_flags(ctx, EVP_CIPHER_CTX_FLAG_WRAP_ALLOW);
			return 1;
		default:
			return -2;
	}
}